

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

void __thiscall
cubeb_resampler_passthrough_input_only_Test::TestBody
          (cubeb_resampler_passthrough_input_only_Test *this)

{
  bool bVar1;
  cubeb_resampler *resampler;
  stringstream *this_00;
  char *message;
  int iVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_880;
  AssertionResult gtest_ar;
  long frames;
  long got;
  AssertHelper local_858;
  cubeb_stream_params input_params;
  float input_buffer [512];
  
  input_params.channels = 2;
  input_params.format = CUBEB_SAMPLE_FLOAT32LE;
  input_params.rate = 0xac44;
  resampler = cubeb_resampler_create
                        ((cubeb_stream *)0x0,&input_params,(cubeb_stream_params *)0x0,0xac44,
                         cb_passthrough_resampler_input,(void *)0x0,CUBEB_RESAMPLER_QUALITY_VOIP,
                         CUBEB_RESAMPLER_RECLOCK_NONE);
  iVar2 = 0x1e;
  do {
    frames = 0x100;
    got = cubeb_resampler_fill(resampler,input_buffer,&frames,(void *)0x0,0);
    local_880.ptr_._0_4_ = 0x100;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar,"got","256",&got,(int *)&local_880);
    if (gtest_ar.success_ == false) {
      this_00 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(this_00);
      *(undefined8 *)(this_00 + *(long *)(*(long *)(this_00 + 0x10) + -0x18) + 0x18) = 0x11;
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      local_880.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00;
      testing::internal::AssertHelper::AssertHelper
                (&local_858,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,0x277,message);
      testing::internal::AssertHelper::operator=(&local_858,(Message *)&local_880);
      testing::internal::AssertHelper::~AssertHelper(&local_858);
      if (((local_880.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (local_880.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_880.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  cubeb_resampler_destroy(resampler);
  return;
}

Assistant:

TEST(cubeb, resampler_passthrough_input_only)
{
  // Test that the passthrough resampler works when there is only an output stream.
  cubeb_stream_params input_params;

  const size_t input_channels = 2;
  input_params.channels = input_channels;
  input_params.rate = 44100;
  input_params.format = CUBEB_SAMPLE_FLOAT32NE;
  int target_rate = input_params.rate;

  cubeb_resampler * resampler =
    cubeb_resampler_create((cubeb_stream*)nullptr, &input_params, nullptr,
                           target_rate, cb_passthrough_resampler_input, nullptr,
                           CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);

  float input_buffer[input_channels * 256];

  long got;
  for (uint32_t i = 0; i < 30; i++) {
    long int frames = 256;
    got = cubeb_resampler_fill(resampler, input_buffer, &frames, nullptr, 0);
    ASSERT_EQ(got, 256);
  }

  cubeb_resampler_destroy(resampler);
}